

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

void __thiscall
duckdb::DuckIndexScanState::TableScanFunc
          (DuckIndexScanState *this,ClientContext *context,TableFunctionInput *data_p,
          DataChunk *output)

{
  DataChunk *pDVar1;
  _func_int **pp_Var2;
  pointer plVar3;
  pointer plVar4;
  FunctionData *pFVar5;
  DuckTransaction *transaction;
  DataTable *this_00;
  LocalTableFunctionState *pLVar6;
  LocalStorage *this_01;
  idx_t fetch_count;
  long lVar7;
  bool bVar8;
  LogicalType local_b0;
  Vector local_vector;
  
  pFVar5 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  pp_Var2 = pFVar5[4]._vptr_FunctionData;
  transaction = DuckTransaction::Get(context,(Catalog *)pp_Var2[0x1b]);
  this_00 = (DataTable *)(**(code **)(*pp_Var2 + 0x80))(pp_Var2);
  pLVar6 = optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->(&data_p->local_state);
  plVar3 = (this->row_ids).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar4 = (this->row_ids).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  ::std::mutex::lock(&this->index_scan_lock);
  if (this->finished == false) {
    pLVar6[1]._vptr_LocalTableFunctionState =
         (_func_int **)(this->next_batch_index).super___atomic_base<unsigned_long>._M_i;
    LOCK();
    (this->next_batch_index).super___atomic_base<unsigned_long>._M_i =
         (this->next_batch_index).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    lVar7 = (long)pLVar6[1]._vptr_LocalTableFunctionState * 0x800;
    fetch_count = ((long)plVar4 - (long)plVar3 >> 3) +
                  (long)pLVar6[1]._vptr_LocalTableFunctionState * -0x800;
    bVar8 = fetch_count < 0x800;
    if (!bVar8) {
      fetch_count = 0x800;
    }
    this->finished = bVar8;
  }
  else {
    lVar7 = 0;
    fetch_count = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->index_scan_lock);
  if (fetch_count != 0) {
    plVar3 = (this->row_ids).super_vector<long,_std::allocator<long>_>.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
    LogicalType::LogicalType(&local_b0,BIGINT);
    Vector::Vector(&local_vector,&local_b0,(data_ptr_t)(plVar3 + lVar7));
    LogicalType::~LogicalType(&local_b0);
    if ((this->super_TableScanGlobalState).projection_ids.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->super_TableScanGlobalState).projection_ids.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      DataTable::Fetch(this_00,transaction,output,&this->column_ids,&local_vector,fetch_count,
                       (ColumnFetchState *)(pLVar6 + 10));
    }
    else {
      pDVar1 = (DataChunk *)(pLVar6 + 2);
      DataChunk::Reset(pDVar1);
      DataTable::Fetch(this_00,transaction,pDVar1,&this->column_ids,&local_vector,fetch_count,
                       (ColumnFetchState *)(pLVar6 + 10));
      DataChunk::ReferenceColumns(output,pDVar1,&(this->super_TableScanGlobalState).projection_ids);
    }
    Vector::~Vector(&local_vector);
  }
  if (output->count == 0) {
    this_01 = LocalStorage::Get(transaction);
    if ((this->super_TableScanGlobalState).projection_ids.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->super_TableScanGlobalState).projection_ids.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      LocalStorage::Scan(this_01,(CollectionScanState *)(pLVar6 + 0x25),&this->column_ids,output);
    }
    else {
      pDVar1 = (DataChunk *)(pLVar6 + 2);
      DataChunk::Reset(pDVar1);
      LocalStorage::Scan(this_01,(CollectionScanState *)(pLVar6 + 0x25),&this->column_ids,pDVar1);
      DataChunk::ReferenceColumns(output,pDVar1,&(this->super_TableScanGlobalState).projection_ids);
    }
  }
  return;
}

Assistant:

void TableScanFunc(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) override {
		auto &bind_data = data_p.bind_data->Cast<TableScanBindData>();
		auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
		auto &tx = DuckTransaction::Get(context, duck_table.catalog);
		auto &storage = duck_table.GetStorage();
		auto &l_state = data_p.local_state->Cast<IndexScanLocalState>();

		auto row_id_count = row_ids.size();
		idx_t scan_count = 0;
		idx_t offset = 0;

		{
			// Synchronize changes to the shared global state.
			lock_guard<mutex> l(index_scan_lock);
			if (!finished) {
				l_state.batch_index = next_batch_index;
				next_batch_index++;

				offset = l_state.batch_index * STANDARD_VECTOR_SIZE;
				auto remaining = row_id_count - offset;
				scan_count = remaining < STANDARD_VECTOR_SIZE ? remaining : STANDARD_VECTOR_SIZE;
				finished = remaining < STANDARD_VECTOR_SIZE ? true : false;
			}
		}

		if (scan_count != 0) {
			auto row_id_data = (data_ptr_t)&row_ids[0 + offset]; // NOLINT - this is not pretty
			Vector local_vector(LogicalType::ROW_TYPE, row_id_data);

			if (CanRemoveFilterColumns()) {
				l_state.all_columns.Reset();
				storage.Fetch(tx, l_state.all_columns, column_ids, local_vector, scan_count, l_state.fetch_state);
				output.ReferenceColumns(l_state.all_columns, projection_ids);
			} else {
				storage.Fetch(tx, output, column_ids, local_vector, scan_count, l_state.fetch_state);
			}
		}

		if (output.size() == 0) {
			auto &local_storage = LocalStorage::Get(tx);
			if (CanRemoveFilterColumns()) {
				l_state.all_columns.Reset();
				local_storage.Scan(l_state.scan_state.local_state, column_ids, l_state.all_columns);
				output.ReferenceColumns(l_state.all_columns, projection_ids);
			} else {
				local_storage.Scan(l_state.scan_state.local_state, column_ids, output);
			}
		}
	}